

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf_impl.cpp
# Opt level: O0

UChar32 utf8_prevCharSafeBody_63(uint8_t *s,int32_t start,int32_t *pi,UChar32 c,UBool strict)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  byte bVar4;
  UChar32 UVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint local_3c;
  uint8_t b3;
  uint8_t b2;
  uint8_t b1;
  int32_t i;
  UBool strict_local;
  UChar32 c_local;
  int32_t *pi_local;
  int32_t start_local;
  uint8_t *s_local;
  
  iVar3 = *pi;
  if (((char)c < -0x40) && (start < iVar3)) {
    iVar8 = iVar3 + -1;
    bVar1 = s[iVar8];
    if ((byte)(bVar1 + 0x3e) < 0x33) {
      if (bVar1 < 0xe0) {
        *pi = iVar8;
        return (bVar1 - 0xc0) * 0x40 | c & 0x3fU;
      }
      if (bVar1 < 0xf0) {
        local_3c = (int)" 000000000000\x1000"[(int)(bVar1 & 0xf)] &
                   1 << (sbyte)((int)(c & 0xffU) >> 5);
      }
      else {
        local_3c = (int)""[(int)(c & 0xffU) >> 4] & 1 << (bVar1 & 7);
      }
      if (local_3c != 0) {
        *pi = iVar8;
        UVar5 = errorValue(1,strict);
        return UVar5;
      }
    }
    else if (((char)bVar1 < -0x40) && (start < iVar8)) {
      uVar6 = c & 0x3f;
      iVar8 = iVar3 + -2;
      bVar4 = s[iVar8];
      if ((bVar4 < 0xe0) || (0xf4 < bVar4)) {
        if (((char)bVar4 < -0x40) && (start < iVar8)) {
          bVar2 = s[iVar3 + -3];
          if ((0xef < bVar2) &&
             ((bVar2 < 0xf5 && (((int)""[(int)(uint)bVar4 >> 4] & 1 << (bVar2 & 7)) != 0)))) {
            *pi = iVar3 + -3;
            uVar6 = (uint)(bVar2 & 7) << 0x12 | (bVar4 & 0x3f) << 0xc | (bVar1 & 0x3f) << 6 | uVar6;
            if (strict < '\x01') {
              return uVar6;
            }
            if (uVar6 < 0xfdd0) {
              return uVar6;
            }
            if ((0xfdef < uVar6) && ((uVar6 & 0xfffe) != 0xfffe)) {
              return uVar6;
            }
            if (0x10ffff < uVar6) {
              return uVar6;
            }
            UVar5 = errorValue(3,strict);
            return UVar5;
          }
        }
      }
      else if (bVar4 < 0xf0) {
        bVar4 = bVar4 & 0xf;
        if (strict == -2) {
          if ((bVar4 != 0) || (0x1f < (byte)(bVar1 + 0x80))) {
            *pi = iVar8;
            return (uint)bVar4 << 0xc | (uint)(byte)(bVar1 + 0x80) << 6 | uVar6;
          }
        }
        else if (((int)" 000000000000\x1000"[(int)(uint)bVar4] & 1 << (sbyte)((int)(uint)bVar1 >> 5)
                 ) != 0) {
          *pi = iVar8;
          uVar7 = (uint)bVar4 << 0xc | (bVar1 & 0x3f) << 6;
          uVar6 = uVar7 | uVar6;
          if (strict < '\x01') {
            return uVar6;
          }
          if (uVar6 < 0xfdd0) {
            return uVar6;
          }
          if ((0xfdef < uVar6) && ((uVar7 | c & 0x3eU) != 0xfffe)) {
            return uVar6;
          }
          if (0x10ffff < uVar6) {
            return uVar6;
          }
          UVar5 = errorValue(2,strict);
          return UVar5;
        }
      }
      else if (((int)""[(int)(uint)bVar1 >> 4] & 1 << (bVar4 & 7)) != 0) {
        *pi = iVar8;
        UVar5 = errorValue(2,strict);
        return UVar5;
      }
    }
  }
  UVar5 = errorValue(0,strict);
  return UVar5;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
utf8_prevCharSafeBody(const uint8_t *s, int32_t start, int32_t *pi, UChar32 c, UBool strict) {
    // *pi is the index of byte c.
    int32_t i=*pi;
    if(U8_IS_TRAIL(c) && i>start) {
        uint8_t b1=s[--i];
        if(U8_IS_LEAD(b1)) {
            if(b1<0xe0) {
                *pi=i;
                return ((b1-0xc0)<<6)|(c&0x3f);
            } else if(b1<0xf0 ? U8_IS_VALID_LEAD3_AND_T1(b1, c) : U8_IS_VALID_LEAD4_AND_T1(b1, c)) {
                // Truncated 3- or 4-byte sequence.
                *pi=i;
                return errorValue(1, strict);
            }
        } else if(U8_IS_TRAIL(b1) && i>start) {
            // Extract the value bits from the last trail byte.
            c&=0x3f;
            uint8_t b2=s[--i];
            if(0xe0<=b2 && b2<=0xf4) {
                if(b2<0xf0) {
                    b2&=0xf;
                    if(strict!=-2) {
                        if(U8_IS_VALID_LEAD3_AND_T1(b2, b1)) {
                            *pi=i;
                            c=(b2<<12)|((b1&0x3f)<<6)|c;
                            if(strict<=0 || !U_IS_UNICODE_NONCHAR(c)) {
                                return c;
                            } else {
                                // strict: forbid non-characters like U+fffe
                                return errorValue(2, strict);
                            }
                        }
                    } else {
                        // strict=-2 -> lenient: allow surrogates
                        b1-=0x80;
                        if((b2>0 || b1>=0x20)) {
                            *pi=i;
                            return (b2<<12)|(b1<<6)|c;
                        }
                    }
                } else if(U8_IS_VALID_LEAD4_AND_T1(b2, b1)) {
                    // Truncated 4-byte sequence.
                    *pi=i;
                    return errorValue(2, strict);
                }
            } else if(U8_IS_TRAIL(b2) && i>start) {
                uint8_t b3=s[--i];
                if(0xf0<=b3 && b3<=0xf4) {
                    b3&=7;
                    if(U8_IS_VALID_LEAD4_AND_T1(b3, b2)) {
                        *pi=i;
                        c=(b3<<18)|((b2&0x3f)<<12)|((b1&0x3f)<<6)|c;
                        if(strict<=0 || !U_IS_UNICODE_NONCHAR(c)) {
                            return c;
                        } else {
                            // strict: forbid non-characters like U+fffe
                            return errorValue(3, strict);
                        }
                    }
                }
            }
        }
    }
    return errorValue(0, strict);
}